

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void load_buffer_4x16(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  int in_ECX;
  int in_EDX;
  int16_t *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int16_t *tmp;
  int16_t *botL;
  int16_t *topL;
  
  if (in_ECX != 0) {
    in_RDI = in_RDI + (long)(in_EDX << 3) * 2;
  }
  load_buffer_4x8(in_RSI,(__m128i *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  load_buffer_4x8(in_RSI,(__m128i *)CONCAT44(in_EDX,in_ECX),in_R8D,in_R9D,
                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return;
}

Assistant:

static inline void load_buffer_4x16(const int16_t *input, __m128i *out,
                                    const int stride, const int flipud,
                                    const int fliplr, const int shift) {
  const int16_t *topL = input;
  const int16_t *botL = input + 8 * stride;

  const int16_t *tmp;

  if (flipud) {
    tmp = topL;
    topL = botL;
    botL = tmp;
  }
  load_buffer_4x8(topL, out, stride, flipud, fliplr, shift);
  load_buffer_4x8(botL, out + 8, stride, flipud, fliplr, shift);
}